

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiArea::closeAllSubWindows(QMdiArea *this)

{
  bool bVar1;
  QMdiAreaPrivate *pQVar2;
  const_iterator o;
  QWidget *this_00;
  int __fd;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QList<QPointer<QMdiSubWindow>_> *__range1;
  QMdiAreaPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPointer<QMdiSubWindow>_> subWindows;
  QList<QPointer<QMdiSubWindow>_> *in_stack_ffffffffffffffa8;
  QList<QPointer<QMdiSubWindow>_> *in_stack_ffffffffffffffb0;
  QMdiSubWindow *child_00;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QMdiArea *)0x613625);
  bVar1 = QList<QPointer<QMdiSubWindow>_>::isEmpty((QList<QPointer<QMdiSubWindow>_> *)0x61363b);
  if (!bVar1) {
    pQVar2->isSubWindowsTiled = false;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QPointer<QMdiSubWindow>_>::QList(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    child_00 = (QMdiSubWindow *)&local_20;
    local_28.i = (QPointer<QMdiSubWindow> *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QPointer<QMdiSubWindow>_>::begin((QList<QPointer<QMdiSubWindow>_> *)child_00);
    o = QList<QPointer<QMdiSubWindow>_>::end((QList<QPointer<QMdiSubWindow>_> *)child_00);
    while (bVar1 = QList<QPointer<QMdiSubWindow>_>::const_iterator::operator!=(&local_28,o), bVar1)
    {
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator*(&local_28);
      this_00 = &::QPointer::operator_cast_to_QMdiSubWindow_((QPointer<QMdiSubWindow> *)0x61370c)->
                 super_QWidget;
      __fd = 0xb1f06e;
      bVar1 = sanityCheck(child_00,(char *)this_00);
      if (bVar1) {
        QWidget::close(this_00,__fd);
      }
      QList<QPointer<QMdiSubWindow>_>::const_iterator::operator++(&local_28);
    }
    QMdiAreaPrivate::updateScrollBars((QMdiAreaPrivate *)subWindows.d.size);
    QList<QPointer<QMdiSubWindow>_>::~QList((QList<QPointer<QMdiSubWindow>_> *)0x61374f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiArea::closeAllSubWindows()
{
    Q_D(QMdiArea);
    if (d->childWindows.isEmpty())
        return;

    d->isSubWindowsTiled = false;
    // Take a copy because the child->close() call below may end up indirectly calling
    // QCoreApplication::send{Spontaneous}Event(), which may call unknown code that
    // could e.g. recurse into the class modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::closeAllSubWindows"))
            continue;
        child->close();
    }

    d->updateScrollBars();
}